

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string.h
# Opt level: O2

char  [7] __thiscall kj::str<char_const(&)[110]>(kj *this,char (*params) [110])

{
  ArrayPtr<const_char> local_18;
  
  local_18 = toCharSequence<char_const(&)[110]>(params);
  _::concat<kj::ArrayPtr<char_const>>
            ((String *)this,(_ *)&local_18,(ArrayPtr<const_char> *)local_18.size_);
  return SUB87(this,0);
}

Assistant:

String str(Params&&... params) {
  // Magic function which builds a string from a bunch of arbitrary values.  Example:
  //     str(1, " / ", 2, " = ", 0.5)
  // returns:
  //     "1 / 2 = 0.5"
  // To teach `str` how to stringify a type, see `Stringifier`.

  return _::concat(toCharSequence(kj::fwd<Params>(params))...);
}